

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

Image * __thiscall Image::nearestNeighbourInterpolation(Image *__return_storage_ptr__,Image *this)

{
  int **ppiVar1;
  int *piVar2;
  int *piVar3;
  int row;
  int col;
  int **ppiVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  row = this->row * 2;
  col = this->col * 2;
  iVar7 = this->maxGray;
  __return_storage_ptr__->row = row;
  __return_storage_ptr__->col = col;
  __return_storage_ptr__->maxGray = iVar7;
  ppiVar4 = new_matrix<int>(row,col);
  __return_storage_ptr__->matrix = ppiVar4;
  iVar7 = this->row;
  if (0 < iVar7) {
    ppiVar1 = this->matrix;
    uVar6 = (ulong)(uint)this->col;
    uVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        piVar2 = ppiVar1[uVar5 >> 1 & 0x7fffffff];
        piVar3 = ppiVar4[uVar5];
        uVar8 = 0;
        do {
          piVar3[uVar8] = piVar2[uVar8 >> 1 & 0x7fffffff];
          uVar8 = uVar8 + 1;
          uVar6 = (ulong)this->col;
        } while (SBORROW8(uVar8,uVar6 * 2) != (long)(uVar8 + uVar6 * -2) < 0);
        iVar7 = this->row;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)(iVar7 * 2));
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::nearestNeighbourInterpolation()
{
    Image result = Image(2*row, 2*col, maxGray);

    for (int i = 0; i < 2*row; ++i) {
        for (int j = 0; j < 2*col; ++j) {
            result[i][j] = matrix[i/2][j/2];
        }
    }

    return result;
}